

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_multiclasstask.cc
# Opt level: O1

void MulticlassTask::run(search *sch,multi_ex *ec)

{
  ulong *puVar1;
  action aVar2;
  ulong uVar3;
  stringstream *psVar4;
  ostream *poVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  size_t learner_id;
  float loss;
  char local_55;
  action oracle;
  search *local_50;
  ulong local_48;
  ulong local_40;
  multi_ex *local_38;
  
  puVar1 = (ulong *)sch->task_data;
  uVar3 = (ulong)((*(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start)->l).multi.label;
  uVar11 = puVar1[1];
  if (uVar11 == 0) {
    uVar11 = 1;
  }
  else {
    local_40 = uVar3 - 1;
    iVar7 = -1;
    learner_id = 0;
    uVar8 = 0;
    lVar9 = 0;
    local_50 = sch;
    local_48 = uVar3;
    local_38 = ec;
    do {
      uVar6 = (int)uVar11 + iVar7;
      lVar10 = 1L << ((byte)uVar6 & 0x3f);
      oracle = ((local_40 >> ((ulong)uVar6 & 0x3f) & 1) != 0) + 1;
      aVar2 = Search::search::predict
                        (local_50,*(local_38->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start,0,&oracle,1,(ptag *)0x0,
                         (char *)0x0,(action *)puVar1[2],2 - (ulong)(*puVar1 < lVar10 + lVar9 + 1U),
                         (float *)0x0,learner_id,0.0);
      learner_id = (ulong)aVar2 + learner_id * 2;
      lVar10 = lVar10 + lVar9;
      if (aVar2 != 2) {
        lVar10 = lVar9;
      }
      uVar8 = uVar8 + 1;
      uVar11 = puVar1[1];
      iVar7 = iVar7 + -1;
      lVar9 = lVar10;
    } while (uVar8 < uVar11);
    uVar11 = lVar10 + 1;
    uVar3 = local_48;
    sch = local_50;
  }
  if (uVar11 == uVar3) {
    loss = 0.0;
  }
  else {
    loss = 1.0;
  }
  Search::search::loss(sch,loss);
  psVar4 = Search::search::output_abi_cxx11_(sch);
  if (*(int *)(psVar4 + *(long *)(*(long *)psVar4 + -0x18) + 0x20) == 0) {
    psVar4 = Search::search::output_abi_cxx11_(sch);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar4 + 0x10));
    local_55 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_55,1);
  }
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data* my_task_data = sch.get_task_data<task_data>();
  size_t gold_label = ec[0]->l.multi.label;
  size_t label = 0;
  size_t learner_id = 0;

  for (size_t i = 0; i < my_task_data->num_level; i++)
  {
    size_t mask = UINT64_ONE << (my_task_data->num_level - i - 1);
    size_t y_allowed_size = (label + mask + 1 <= my_task_data->max_label) ? 2 : 1;
    action oracle = (((gold_label - 1) & mask) > 0) + 1;
    size_t prediction = sch.predict(*ec[0], 0, &oracle, 1, nullptr, nullptr, my_task_data->y_allowed.begin(),
        y_allowed_size, nullptr, learner_id);  // TODO: do we really need y_allowed?
    learner_id = (learner_id << 1) + prediction;
    if (prediction == 2)
      label += mask;
  }
  label += 1;
  sch.loss(!(label == gold_label));
  if (sch.output().good())
    sch.output() << label << ' ';
}